

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

void __thiscall CVmImageLoader::load(CVmImageLoader *this)

{
  byte bVar1;
  int iVar2;
  vm_meta_entry_t *pvVar3;
  ulong siz;
  CVmImageLoaderMres_std res_ifc;
  char buf [128];
  CVmImageLoaderMres local_d0;
  CVmHostIfc *local_c8;
  undefined4 local_c0;
  int local_b8;
  uint local_b4;
  byte local_b0;
  
  G_image_loader_X = this;
  vm_init_before_load(this->fname_);
  (*G_host_ifc_X->_vptr_CVmHostIfc[8])(G_host_ifc_X,this->fname_);
  read_image_header(this);
LAB_00262598:
  (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,&local_b8,10);
  siz = (ulong)local_b4;
  if (local_b8 < 0x4c45524d) {
    if (local_b8 < 0x46435253) {
      if (local_b8 < 0x444d5953) {
        if (local_b8 == 0x444c434d) {
          load_meta_dep(this,siz);
          goto LAB_00262598;
        }
        if (local_b8 == 0x20464f45) {
          bVar1 = this->field_0x90;
          if ((bVar1 & 4) == 0) {
            err_throw(0x13e);
          }
          if ((bVar1 & 1) == 0) {
            err_throw(0x13a);
          }
          if ((bVar1 & 2) == 0) {
            err_throw(0x13c);
          }
          do_dynamic_link(this);
          fix_gsym_meta(this);
          CVmMetaTable::create_intrinsic_class_instances(G_meta_table_X);
          pvVar3 = CVmMetaTable::get_entry_by_id(G_meta_table_X,"iterator");
          if (pvVar3 != (vm_meta_entry_t *)0x0) {
            if (pvVar3->func_xlat_cnt_ == 0) {
              G_iter_get_next_X = 0;
            }
            else {
              G_iter_get_next_X = *pvVar3->func_xlat_;
              if (pvVar3->func_xlat_cnt_ != 1) {
                G_iter_next_avail_X = pvVar3->func_xlat_[1];
                goto LAB_0026280d;
              }
            }
            G_iter_next_avail_X = 0;
          }
LAB_0026280d:
          (**(code **)(G_code_pool_X.super_CVmPoolPaged._0_8_ + 0x10))
                    (&G_code_pool_X,this->pools_[0]);
          (**(code **)(G_const_pool_X.super_CVmPoolPaged._0_8_ + 0x10))
                    (&G_const_pool_X,this->pools_[1]);
          CVmObjTable::do_all_post_load_init(&G_obj_table_X);
          iVar2 = (*G_host_ifc_X->_vptr_CVmHostIfc[0xb])();
          if (iVar2 != 0) {
            load_ext_resfiles(this);
          }
          vm_init_after_load();
          os_init_ui_after_load(G_bif_table_X,G_meta_table_X);
          G_image_loader_X = (CVmImageLoader *)0x0;
          return;
        }
      }
      else {
        if (local_b8 == 0x444d5953) {
          load_sym_names(this,siz);
          goto LAB_00262598;
        }
        if (local_b8 == 0x44534e46) {
          load_funcset_dep(this,siz);
          goto LAB_00262598;
        }
      }
    }
    else if (local_b8 < 0x47505043) {
      if (local_b8 == 0x46435253) {
        load_srcfiles(this,siz);
        goto LAB_00262598;
      }
      if (local_b8 == 0x46445043) {
        load_const_pool_def(this,siz);
        goto LAB_00262598;
      }
    }
    else {
      if (local_b8 == 0x47505043) {
        load_const_pool_page(this,siz);
        goto LAB_00262598;
      }
      if (local_b8 == 0x494e4953) {
        load_sini(this,siz);
        goto LAB_00262598;
      }
    }
  }
  else {
    if (local_b8 < 0x5243414d) {
      if (local_b8 == 0x4c45524d) {
        local_d0._vptr_CVmImageLoaderMres = (_func_int **)&PTR__CVmImageLoaderMres_003235e0;
        local_c0 = 0;
        local_c8 = G_host_ifc_X;
        load_mres_link(this,siz,&local_d0);
      }
      else if (local_b8 == 0x4d595347) {
        load_gsym(this,siz);
      }
      else {
        if (local_b8 != 0x50544e45) goto LAB_00262765;
        load_entrypt(this,siz);
      }
      goto LAB_00262598;
    }
    if (0x534a424e < local_b8) {
      if (local_b8 == 0x534a424f) {
        load_static_objs(this,siz);
      }
      else {
        if (local_b8 != 0x534c484d) goto LAB_00262765;
        load_mhls(this,siz);
      }
      goto LAB_00262598;
    }
    if (local_b8 == 0x5243414d) {
      load_macros(this,siz);
      goto LAB_00262598;
    }
    if (local_b8 == 0x5345524d) {
      local_d0._vptr_CVmImageLoaderMres = (_func_int **)&PTR__CVmImageLoaderMres_003235e0;
      local_c0 = 0;
      local_c8 = G_host_ifc_X;
      load_mres(this,siz,&local_d0);
      goto LAB_00262598;
    }
  }
LAB_00262765:
  if ((local_b0 & 1) != 0) {
    err_throw_a(0x131,1,8);
  }
  (*this->fp_->_vptr_CVmImageFile[9])();
  goto LAB_00262598;
}

Assistant:

void CVmImageLoader::load(VMG0_)
{
    char buf[128];
    int done;

    /* set myself to be the global image loader */
    G_image_loader = this;

    /* 
     *   perform additional initialization now that we're about to load
     *   the image file 
     */
    vm_init_before_load(vmg_ fname_);

    /* tell the host application the name of the image file */
    G_host_ifc->set_image_name(fname_);

    /* read and validate the header */
    read_image_header();

    /* load the data blocks */
    for (done = FALSE ; !done ; )
    {
        ulong siz;
        uint flags;
        
        /* read the next data block header */
        fp_->copy_data(buf, 10);

        /* get the size */
        siz = t3rp4u(buf + 4);

        /* get the flags */
        flags = osrp2(buf + 8);

        /* load the block according to its type */
        if (block_type_is(buf, "CPPG"))
        {
            /* load the constant pool page block */
            load_const_pool_page(siz);
        }
        else if (block_type_is(buf, "ENTP"))
        {
            /* load the entrypoint */
            load_entrypt(vmg_ siz);
        }
        else if (block_type_is(buf, "OBJS"))
        {
            /* load static object block */
            load_static_objs(vmg_ siz);
        }
        else if (block_type_is(buf, "CPDF"))
        {
            /* load the constant pool definition block */
            load_const_pool_def(siz);
        }
        else if (block_type_is(buf, "MRES"))
        {
            /* 
             *   load the multimedia resource block (the main image file
             *   is always file number zero) 
             */
            CVmImageLoaderMres_std res_ifc(0, G_host_ifc);
            load_mres(siz, &res_ifc);
        }
        else if (block_type_is(buf, "MREL"))
        {
            /* load the multimedia resource link block */
            CVmImageLoaderMres_std res_ifc(0, G_host_ifc);
            load_mres_link(siz, &res_ifc);
        }
        else if (block_type_is(buf, "MCLD"))
        {
            /* load metaclass dependency block */
            load_meta_dep(vmg_ siz);
        }
        else if (block_type_is(buf, "FNSD"))
        {
            /* load function set dependency list block */
            load_funcset_dep(vmg_ siz);
        }
        else if (block_type_is(buf, "SYMD"))
        {
            /* load symbolic names export block */
            load_sym_names(vmg_ siz);
        }
        else if (block_type_is(buf, "SRCF"))
        {
            /* load the source file list */
            load_srcfiles(vmg_ siz);
        }
        else if (block_type_is(buf, "GSYM"))
        {
            /* load the global symbols block */
            load_gsym(vmg_ siz);
        }
        else if (block_type_is(buf, "MACR"))
        {
            /* load the macro symbols block */
            load_macros(vmg_ siz);
        }
        else if (block_type_is(buf, "MHLS"))
        {
            /* load the method header list block */
            load_mhls(vmg_ siz);
        }
        else if (block_type_is(buf, "SINI"))
        {
            /* load the static initializer block */
            load_sini(vmg_ siz);
        }
        else if (block_type_is(buf, "EOF "))
        {
            /* end of file - we can stop looking now */
            done = TRUE;
        }
        else
        {
            /*
             *   This block type is unknown, so ignore it.  If a new block
             *   type is added in the future, an older VM version won't
             *   recognize the new block, but it can still load the image
             *   file simply by omitting any unrecognized new blocks.  Since
             *   the image file will not be complete in this case, it may not
             *   work properly.
             *   
             *   To allow for future block types which contain advisory data,
             *   which can safely be ignored by older VM versions, while also
             *   allowing for the possibility of changes that create
             *   incompatibilities, we have a flag in the header that
             *   indicates whether the block is required or not.  If this
             *   block is marked as mandatory, throw an error, since we don't
             *   recognize the block.  Note that this is a version-related
             *   error (i.e., a VM update should fix it), so set the version
             *   flag in the exception.  
             */
            if ((flags & VMIMAGE_DBF_MANDATORY) != 0)
                err_throw_a(VMERR_UNKNOWN_IMAGE_BLOCK, 1,
                            ERR_TYPE_VERSION_FLAG);

            /* skip past the block */
            fp_->skip_ahead(siz);
        }
    }

    /* the image file is required to contain an entrypoint definition */
    if (!loaded_entrypt_)
        err_throw(VMERR_IMAGE_NO_ENTRYPT);

    /* the image file is required to contain a metaclass dependency table */
    if (!loaded_meta_dep_)
        err_throw(VMERR_IMAGE_NO_METADEP);

    /* the image is required to have a function set dependency table */
    if (!loaded_funcset_dep_)
        err_throw(VMERR_IMAGE_NO_FUNCDEP);

    /* complete the dynamic linking */
    do_dynamic_link(vmg0_);

    /* fix up the global symbol table metaclasses, if applicable */
    fix_gsym_meta(vmg0_);

    /* 
     *   create an IntrinsicClass instance for each metaclass that the
     *   image file is using and for which the compiler didn't supply its
     *   own IntrinsicClass object 
     */
    G_meta_table->create_intrinsic_class_instances(vmg0_);

    /* 
     *   Cache certain metaclass method table entries that are used by the
     *   VM: Iterator.getNext [Iterator#1], Iterator.isNextAvailable
     *   [Iterator#2].  
     */
    vm_meta_entry_t *mcoll = G_meta_table->get_entry_by_id("iterator");
    if (mcoll != 0)
    {
        G_iter_get_next = mcoll->xlat_func(1);
        G_iter_next_avail = mcoll->xlat_func(2);
    }

    /* 
     *   Attach the code pool and constant pool to their backing stores,
     *   which are the pool objects we loaded from the image file. 
     */
    G_code_pool->attach_backing_store(pools_[0]);
    G_const_pool->attach_backing_store(pools_[1]);

    /* perform any requested post-load object initializations */
    G_obj_table->do_all_post_load_init(vmg0_);

    /* load external resource files if possible */
    if (G_host_ifc->can_add_resfiles())
        load_ext_resfiles(vmg0_);

    /* 
     *   perform additional initialization now that we've finished
     *   loading the image file
     */
    vm_init_after_load(vmg0_);

    /* 
     *   Let the UI inspect the built-ins linked by the program.  The UI
     *   might use different initial display configurations depending on the
     *   function sets and/or intrinsic classes the program uses.  For
     *   example, Workbench on Windows initially hides the HTML TADS window
     *   if the network functions are linked, since these are normally used
     *   to implement a Web UI, which uses a separate display window.
     */
    os_init_ui_after_load(G_bif_table, G_meta_table);

    /* forget the image loader */
    G_image_loader = 0;
}